

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall HVectorBase<HighsCDouble>::setup(HVectorBase<HighsCDouble> *this,HighsInt size_)

{
  value_type local_28;
  
  this->size = size_;
  this->count = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->index,(long)size_);
  local_28.hi = 0.0;
  local_28.lo = 0.0;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
            (&this->array,(long)this->size,&local_28);
  local_28.hi = (double)((ulong)local_28.hi & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::_M_fill_assign
            (&this->cwork,(long)this->size + 0x1900,(value_type *)&local_28);
  local_28.hi = (double)((ulong)local_28.hi & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->iwork,(long)this->size << 2,(value_type_conflict2 *)&local_28);
  this->packCount = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->packIndex,(long)this->size);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::resize
            (&this->packValue,(long)this->size);
  this->packFlag = false;
  this->synthetic_tick = 0.0;
  this->next = (HVectorBase<HighsCDouble> *)0x0;
  return;
}

Assistant:

void HVectorBase<Real>::setup(HighsInt size_) {
  /*
   * Initialise an HVector instance
   */
  size = size_;
  count = 0;
  index.resize(size);
  array.assign(size, Real{0});
  cwork.assign(size + 6400, 0);  // MAX invert
  iwork.assign(size * 4, 0);

  packCount = 0;
  packIndex.resize(size);
  packValue.resize(size);

  // Initialise three values that are initialised in clear(), but
  // weren't originally initialised in setup(). Probably doesn't
  // matter, since clear() is usually called before a vector is
  // (re-)used.
  packFlag = false;
  synthetic_tick = 0;
  next = 0;
}